

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

xml_node * xml_parse_node(xml_parser *parser)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t uVar3;
  int iVar4;
  xml_node **__ptr;
  xml_string *__ptr_00;
  xml_attribute **__ptr_01;
  char *str;
  char *pcVar5;
  size_t sVar6;
  char *__s;
  char *__s_00;
  undefined8 *puVar7;
  undefined8 *puVar8;
  xml_node *pxVar9;
  ushort **ppuVar10;
  xml_string *__ptr_02;
  xml_string *__ptr_03;
  ulong uVar11;
  size_t sVar12;
  char **nextp;
  char **nextp_00;
  char **nextp_01;
  size_t sVar13;
  size_t sVar14;
  xml_node **ppxVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  int local_58;
  undefined8 local_48;
  size_t local_40;
  xml_node **local_38;
  
  __ptr = (xml_node **)calloc(1,8);
  xml_skip_whitespace(parser);
  uVar3 = xml_parser_peek(parser,0);
  if (uVar3 == '<') {
    uVar11 = parser->position + 1;
    parser->position = uVar11;
    if (parser->length <= uVar11) {
      parser->position = parser->length - 1;
    }
    __ptr_00 = xml_parse_tag_end(parser);
    if (__ptr_00 != (xml_string *)0x0) {
      sVar13 = __ptr_00->length;
      local_48 = 0;
      __ptr_01 = (xml_attribute **)calloc(1,8);
      str = (char *)calloc(sVar13 + 1,1);
      memcpy(str,__ptr_00->buffer,sVar13);
      str[sVar13] = '\0';
      pcVar5 = xml_strtok_r(str,(char *)&local_48,nextp);
      sVar6 = sVar13;
      if (pcVar5 != (char *)0x0) {
        sVar6 = strlen(pcVar5);
        __ptr_00->length = sVar6;
        pcVar5 = xml_strtok_r((char *)0x0,(char *)&local_48,nextp_00);
        ppxVar15 = __ptr;
        if (pcVar5 != (char *)0x0) {
          do {
            local_38 = ppxVar15;
            sVar6 = strlen(pcVar5);
            __s = (char *)malloc(sVar6 + 1);
            __s_00 = (char *)malloc(sVar6 + 1);
            iVar4 = __isoc99_sscanf(pcVar5,"%[^=]=\"%[^\"]",__s,__s_00);
            if ((iVar4 == 2) ||
               (iVar4 = __isoc99_sscanf(pcVar5,"%[^=]=\'%[^\']",__s,__s_00), iVar4 == 2)) {
              local_58 = (int)str;
              puVar1 = __ptr_00->buffer;
              sVar6 = strlen(__s);
              puVar7 = (undefined8 *)malloc(0x10);
              puVar8 = (undefined8 *)malloc(0x10);
              *puVar7 = puVar8;
              *puVar8 = puVar1 + ((int)pcVar5 - local_58);
              puVar8[1] = sVar6;
              puVar8 = (undefined8 *)malloc(0x10);
              puVar7[1] = puVar8;
              *puVar8 = puVar1 + ((int)pcVar5 - local_58) + sVar6 + 2;
              sVar6 = strlen(__s_00);
              puVar8[1] = sVar6;
              sVar6 = 8;
              do {
                sVar14 = sVar6;
                sVar6 = sVar14 + 8;
              } while (*(long *)((long)__ptr_01 + (sVar14 - 8)) != 0);
              __ptr_01 = (xml_attribute **)realloc(__ptr_01,sVar14 + 8);
              *(undefined8 **)((long)__ptr_01 + (sVar14 - 8)) = puVar7;
              *(undefined8 *)((long)__ptr_01 + sVar14) = 0;
              __ptr = local_38;
            }
            free(__s);
            free(__s_00);
            pcVar5 = xml_strtok_r((char *)0x0,(char *)&local_48,nextp_01);
            ppxVar15 = local_38;
          } while (pcVar5 != (char *)0x0);
          sVar6 = __ptr_00->length;
        }
      }
      free(str);
      if ((sVar6 != 0) && (__ptr_00->buffer[sVar13 - 1] == '/')) {
        __ptr_02 = (xml_string *)0x0;
        goto LAB_001016d1;
      }
      uVar3 = xml_parser_peek(parser,0);
      local_40 = sVar6;
      if (uVar3 == '<') {
        uVar3 = xml_parser_peek(parser,1);
        __ptr_02 = (xml_string *)0x0;
        while (uVar3 != '/') {
          pxVar9 = xml_parse_node(parser);
          if (pxVar9 == (xml_node *)0x0) {
            xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_node::child");
            __ptr_02 = (xml_string *)0x0;
            goto LAB_001019c4;
          }
          sVar13 = 8;
          do {
            sVar6 = sVar13;
            sVar13 = sVar6 + 8;
          } while (*(long *)((long)__ptr + (sVar6 - 8)) != 0);
          __ptr = (xml_node **)realloc(__ptr,sVar6 + 8);
          *(xml_node **)((long)__ptr + (sVar6 - 8)) = pxVar9;
          *(undefined8 *)((long)__ptr + sVar6) = 0;
          uVar3 = xml_parser_peek(parser,1);
        }
LAB_001018e8:
        xml_skip_whitespace(parser);
        uVar3 = xml_parser_peek(parser,0);
        if (uVar3 == '<') {
          uVar3 = xml_parser_peek(parser,1);
          if (uVar3 != '/') goto LAB_0010198b;
          uVar11 = parser->position + 2;
          parser->position = uVar11;
          if (parser->length <= uVar11) {
            parser->position = parser->length - 1;
          }
          __ptr_03 = xml_parse_tag_end(parser);
          if (__ptr_03 != (xml_string *)0x0) {
            if (local_40 == __ptr_03->length) {
              if (local_40 != 0) {
                sVar13 = 0;
                do {
                  if (__ptr_00->buffer[sVar13] != __ptr_03->buffer[sVar13]) goto LAB_001019e2;
                  sVar13 = sVar13 + 1;
                } while (local_40 != sVar13);
              }
              free(__ptr_03);
LAB_001016d1:
              pxVar9 = (xml_node *)malloc(0x20);
              pxVar9->name = __ptr_00;
              pxVar9->content = __ptr_02;
              pxVar9->attributes = __ptr_01;
              pxVar9->children = __ptr;
              return pxVar9;
            }
LAB_001019e2:
            xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag missmatch");
            free(__ptr_00);
            __ptr_00 = __ptr_03;
            goto LAB_001019c4;
          }
        }
        else {
          xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_close::expected closing tag `<\'"
                          );
LAB_0010198b:
          uVar3 = xml_parser_peek(parser,1);
          if (uVar3 != '/') {
            xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_tag_close::expected closing tag `/\'")
            ;
          }
        }
        xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_close");
      }
      else {
        xml_skip_whitespace(parser);
        uVar11 = parser->position;
        uVar2 = parser->length;
        sVar12 = uVar2 - uVar11;
        if (uVar2 < uVar11 || sVar12 == 0) {
          sVar18 = 0;
        }
        else {
          sVar17 = 0;
          uVar16 = uVar11;
          do {
            uVar3 = xml_parser_peek(parser,0);
            sVar18 = sVar17;
            if (uVar3 == '<') break;
            uVar16 = uVar16 + 1;
            if (uVar2 <= uVar16) {
              uVar16 = uVar2 - 1;
            }
            parser->position = uVar16;
            sVar17 = sVar17 + 1;
            sVar18 = sVar12;
          } while (sVar12 != sVar17);
        }
        uVar3 = xml_parser_peek(parser,0);
        if (uVar3 == '<') {
          puVar1 = parser->buffer;
          if (sVar18 == 0) {
            sVar18 = 0;
          }
          else {
            ppuVar10 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar10 + (ulong)puVar1[sVar18 + (uVar11 - 1)] * 2 + 1) & 0x20)
                  == 0) goto LAB_001018c7;
              sVar18 = sVar18 - 1;
            } while (sVar18 != 0);
            sVar18 = 0;
          }
LAB_001018c7:
          __ptr_02 = (xml_string *)malloc(0x10);
          __ptr_02->buffer = puVar1 + uVar11;
          __ptr_02->length = sVar18;
          goto LAB_001018e8;
        }
        __ptr_02 = (xml_string *)0x0;
        xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_content::expected <");
        xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_node::content");
      }
LAB_001019c4:
      free(__ptr_00);
      if (__ptr_02 != (xml_string *)0x0) {
        free(__ptr_02);
      }
      goto LAB_00101711;
    }
  }
  else {
    xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_open::expected opening tag");
  }
  xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_open");
LAB_00101711:
  pxVar9 = *__ptr;
  ppxVar15 = __ptr;
  while (pxVar9 != (xml_node *)0x0) {
    ppxVar15 = ppxVar15 + 1;
    xml_node_free(pxVar9);
    pxVar9 = *ppxVar15;
  }
  free(__ptr);
  return (xml_node *)0x0;
}

Assistant:

static struct xml_node* xml_parse_node(struct xml_parser* parser) {
	xml_parser_info(parser, "node");

	/* Setup variables
	 */
	struct xml_string* tag_open = 0;
	struct xml_string* tag_close = 0;
	struct xml_string* content = 0;

	size_t original_length;
	struct xml_attribute** attributes;

	struct xml_node** children = calloc(1, sizeof(struct xml_node*));
	children[0] = 0;


	/* Parse open tag
	 */
	tag_open = xml_parse_tag_open(parser);
	if (!tag_open) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_open");
		goto exit_failure;
	}

	original_length = tag_open->length;
	attributes = xml_find_attributes(parser, tag_open);

	/* If tag ends with `/' it's self closing, skip content lookup */
	if (tag_open->length > 0 && '/' == tag_open->buffer[original_length - 1]) {
		/* Drop `/'
		 */
		goto node_creation;
	}

	/* If the content does not start with '<', a text content is assumed
	 */
	if ('<' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		content = xml_parse_content(parser);

		if (!content) {
			xml_parser_error(parser, 0, "xml_parse_node::content");
			goto exit_failure;
		}


	/* Otherwise children are to be expected
	 */
	} else while ('/' != xml_parser_peek(parser, NEXT_CHARACTER)) {

		/* Parse child node
		 */
		struct xml_node* child = xml_parse_node(parser);
		if (!child) {
			xml_parser_error(parser, NEXT_CHARACTER, "xml_parse_node::child");
			goto exit_failure;
		}

		/* Grow child array :)
		 */
		size_t old_elements = get_zero_terminated_array_nodes(children);
		size_t new_elements = old_elements + 1;
		children = realloc(children, (new_elements + 1) * sizeof(struct xml_node*));

		/* Save child
		 */
		children[new_elements - 1] = child;
		children[new_elements] = 0;
	}


	/* Parse close tag
	 */
	tag_close = xml_parse_tag_close(parser);
	if (!tag_close) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_close");
		goto exit_failure;
	}


	/* Close tag has to match open tag
	 */
	if (!xml_string_equals(tag_open, tag_close)) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag missmatch");
		goto exit_failure;
	}


	/* Return parsed node
	 */
	xml_string_free(tag_close);

node_creation:;
	struct xml_node* node = malloc(sizeof(struct xml_node));
	node->name = tag_open;
	node->content = content;
	node->attributes = attributes;
	node->children = children;
	return node;


	/* A failure occured, so free all allocalted resources
	 */
exit_failure:
	if (tag_open) {
		xml_string_free(tag_open);
	}
	if (tag_close) {
		xml_string_free(tag_close);
	}
	if (content) {
		xml_string_free(content);
	}

	struct xml_node** it = children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(children);

	return 0;
}